

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTSoundBank_Prepare
                   (FACTSoundBank *pSoundBank,uint16_t nCueIndex,uint32_t dwFlags,int32_t timeOffset
                   ,FACTCue **ppCue)

{
  ushort uVar1;
  FACTCueData *pFVar2;
  FACTAudioEngine *pFVar3;
  FACTVariable *pFVar4;
  FACTCue *pFVar5;
  uint32_t uVar6;
  FACTCue *pFVar7;
  float *pfVar8;
  uint32_t *puVar9;
  FACTCue *pFVar10;
  long lVar11;
  
  if (pSoundBank == (FACTSoundBank *)0x0) {
    *ppCue = (FACTCue *)0x0;
    uVar6 = 1;
  }
  else {
    pFVar7 = (FACTCue *)(*pSoundBank->parentEngine->pMalloc)(0xb0);
    *ppCue = pFVar7;
    SDL_memset(pFVar7,0,0xb0);
    FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);
    (*ppCue)->parentBank = pSoundBank;
    (*ppCue)->next = (FACTCue *)0x0;
    pFVar7 = *ppCue;
    pFVar7->managed = '\0';
    pFVar7->index = nCueIndex;
    pFVar7->notifyOnDestroy = '\0';
    pFVar7->usercontext = (void *)0x0;
    (*ppCue)->data = (FACTCueData *)(&pSoundBank->cues->flags + (uint)nCueIndex * 0x14);
    pFVar7 = *ppCue;
    pFVar2 = pFVar7->data;
    if ((pFVar2->flags & 4) == 0) {
      if (pSoundBank->variationCount != 0) {
        puVar9 = pSoundBank->variationCodes;
        lVar11 = 0;
        do {
          if (pFVar2->sbCode == *puVar9) {
            (pFVar7->field_7).variation =
                 (FACTVariationTable *)((long)pSoundBank->variations - lVar11);
            pFVar7 = *ppCue;
            break;
          }
          lVar11 = lVar11 + -0x10;
          puVar9 = puVar9 + 1;
        } while ((ulong)pSoundBank->variationCount * 0x10 + lVar11 != 0);
      }
      if (((pFVar7->field_7).variation)->flags == '\x03') {
        pFVar7->interactive =
             pSoundBank->parentEngine->variables[((pFVar7->field_7).variation)->variable].
             initialValue;
      }
    }
    else if (pSoundBank->soundCount != 0) {
      puVar9 = pSoundBank->soundCodes;
      lVar11 = 0;
      do {
        if (pFVar2->sbCode == *puVar9) {
          (pFVar7->field_7).variation = (FACTVariationTable *)((long)pSoundBank->sounds - lVar11);
          break;
        }
        lVar11 = lVar11 + -0x28;
        puVar9 = puVar9 + 1;
      } while ((ulong)pSoundBank->soundCount * 0x28 + lVar11 != 0);
    }
    pfVar8 = (float *)(*pSoundBank->parentEngine->pMalloc)
                                ((ulong)pSoundBank->parentEngine->variableCount << 2);
    (*ppCue)->variableValues = pfVar8;
    pFVar3 = pSoundBank->parentEngine;
    uVar1 = pFVar3->variableCount;
    pFVar7 = *ppCue;
    if (uVar1 != 0) {
      pFVar4 = pFVar3->variables;
      pfVar8 = pFVar7->variableValues;
      lVar11 = 0;
      do {
        *(float *)((long)pfVar8 + lVar11) = (&pFVar4->initialValue)[lVar11];
        lVar11 = lVar11 + 4;
      } while ((ulong)uVar1 * 4 != lVar11);
    }
    pFVar7->state = 4;
    pFVar5 = pSoundBank->cueList;
    while (pFVar10 = pFVar5, pFVar10 != (FACTCue *)0x0) {
      pSoundBank = (FACTSoundBank *)pFVar10;
      pFVar5 = pFVar10->next;
    }
    pSoundBank->cueList = pFVar7;
    FAudio_PlatformUnlockMutex(pFVar3->apiLock);
    uVar6 = 0;
  }
  return uVar6;
}

Assistant:

uint32_t FACTSoundBank_Prepare(
	FACTSoundBank *pSoundBank,
	uint16_t nCueIndex,
	uint32_t dwFlags,
	int32_t timeOffset,
	FACTCue** ppCue
) {
	uint16_t i;
	FACTCue *latest;

	if (pSoundBank == NULL)
	{
		*ppCue = NULL;
		return 1;
	}

	*ppCue = (FACTCue*) pSoundBank->parentEngine->pMalloc(sizeof(FACTCue));
	FAudio_zero(*ppCue, sizeof(FACTCue));

	FAudio_PlatformLockMutex(pSoundBank->parentEngine->apiLock);

	/* Engine references */
	(*ppCue)->parentBank = pSoundBank;
	(*ppCue)->next = NULL;
	(*ppCue)->managed = 0;
	(*ppCue)->index = nCueIndex;
	(*ppCue)->notifyOnDestroy = 0;
	(*ppCue)->usercontext = NULL;

	/* Sound data */
	(*ppCue)->data = &pSoundBank->cues[nCueIndex];
	if ((*ppCue)->data->flags & 0x04)
	{
		for (i = 0; i < pSoundBank->soundCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->soundCodes[i])
			{
				(*ppCue)->sound = &pSoundBank->sounds[i];
				break;
			}
		}
	}
	else
	{
		for (i = 0; i < pSoundBank->variationCount; i += 1)
		{
			if ((*ppCue)->data->sbCode == pSoundBank->variationCodes[i])
			{
				(*ppCue)->variation = &pSoundBank->variations[i];
				break;
			}
		}
		if ((*ppCue)->variation->flags == 3)
		{
			(*ppCue)->interactive = pSoundBank->parentEngine->variables[
				(*ppCue)->variation->variable
			].initialValue;
		}
	}

	/* Instance data */
	(*ppCue)->variableValues = (float*) pSoundBank->parentEngine->pMalloc(
		sizeof(float) * pSoundBank->parentEngine->variableCount
	);
	for (i = 0; i < pSoundBank->parentEngine->variableCount; i += 1)
	{
		(*ppCue)->variableValues[i] =
			pSoundBank->parentEngine->variables[i].initialValue;
	}

	/* Playback */
	(*ppCue)->state = FACT_STATE_PREPARED;

	/* Add to the SoundBank Cue list */
	if (pSoundBank->cueList == NULL)
	{
		pSoundBank->cueList = *ppCue;
	}
	else
	{
		latest = pSoundBank->cueList;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = *ppCue;
	}

	FAudio_PlatformUnlockMutex(pSoundBank->parentEngine->apiLock);
	return 0;
}